

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMLSession.cpp
# Opt level: O1

void __thiscall ki::protocol::net::DMLSession::on_application_message(DMLSession *this)

{
  PacketHeader *in_RSI;
  
  on_application_message
            ((DMLSession *)((long)&this->_vptr_DMLSession + (long)this->_vptr_DMLSession[-7]),in_RSI
            );
  return;
}

Assistant:

void DMLSession::on_application_message(const PacketHeader& header)
	{
		// Attempt to create a Message instance from the data in the stream
		auto error_code = InvalidDMLMessageErrorCode::NONE;
		const dml::Message *message = nullptr;
		try
		{
			message = m_manager.message_from_binary(m_data_stream);
		}
		catch (parse_error &e)
		{
			switch (e.get_error_code())
			{
			case parse_error::INVALID_HEADER_DATA:
				error_code = InvalidDMLMessageErrorCode::INVALID_HEADER_DATA;
				break;
			case parse_error::INSUFFICIENT_MESSAGE_DATA:
			case parse_error::INVALID_MESSAGE_DATA:
				error_code = InvalidDMLMessageErrorCode::INVALID_MESSAGE_DATA;
				break;
			default:
				error_code = InvalidDMLMessageErrorCode::UNKNOWN;
			}
		}
		catch (value_error &e)
		{
			switch (e.get_error_code())
			{
			case value_error::DML_INVALID_SERVICE:
				error_code = InvalidDMLMessageErrorCode::INVALID_SERVICE;
				break;
			case value_error::DML_INVALID_MESSAGE_TYPE:
				error_code = InvalidDMLMessageErrorCode::INVALID_MESSAGE_TYPE;
				break;
			default:
				error_code = InvalidDMLMessageErrorCode::UNKNOWN;
			}
		}

		if (!message)
		{
			on_invalid_message(error_code);
			return;
		}

		// Are we sufficiently authenticated to handle this message?
		if (get_access_level() >= message->get_access_level())
			on_message(message);
		else
			on_invalid_message(InvalidDMLMessageErrorCode::INSUFFICIENT_ACCESS);
		delete message;
	}